

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

int __thiscall QFutureInterfaceBase::resultCount(QFutureInterfaceBase *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> lock;
  QMutex *in_stack_ffffffffffffffb8;
  QFutureInterfaceBasePrivate *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  iVar2 = QFutureInterfaceBasePrivate::internal_resultCount(in_stack_ffffffffffffffc0);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QFutureInterfaceBase::resultCount() const
{
    QMutexLocker lock(&d->m_mutex);
    return d->internal_resultCount();
}